

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppix_manager.c
# Opt level: O1

int write_ppixfaix(int coff,int compno,opj_codestream_info_t cstr_info,opj_bool EPHused,int j2klen,
                  opj_cio_t *cio)

{
  int pos;
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong v;
  long lVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  ulong local_170;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_128;
  long local_120;
  long local_110;
  long local_108;
  
  pos = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x66616978,4);
  iVar23 = 0;
  cio_write(cio,0,1);
  lVar5 = (long)compno;
  if (-1 < cstr_info.numdecompos[lVar5]) {
    lVar12 = 0;
    iVar23 = 0;
    do {
      iVar23 = iVar23 + (cstr_info.tile)->pw[lVar12] * (cstr_info.tile)->ph[lVar12] *
                        cstr_info.numlayers;
      lVar12 = lVar12 + 1;
    } while ((ulong)(uint)cstr_info.numdecompos[lVar5] + 1 != lVar12);
  }
  cio_write(cio,(long)iVar23,4);
  v = (long)cstr_info.th * (long)cstr_info.tw;
  cio_write(cio,v,4);
  if (0 < (int)v) {
    lVar6 = (long)cstr_info.numcomps;
    lVar9 = (long)cstr_info.numlayers;
    lVar12 = lVar9 * 0x20;
    lVar2 = lVar6 * lVar9 * 0x20;
    lVar7 = lVar6 * 0x20;
    local_108 = -1;
    local_170 = 0;
    local_120 = -1;
    do {
      if (cstr_info.numdecompos[lVar5] < 0) {
        iVar15 = 0;
      }
      else {
        lVar13 = (ulong)(uint)cstr_info.numdecompos[lVar5] + 1;
        lVar3 = (long)(int)lVar13;
        local_138 = lVar9 * lVar5 * 0x20 * lVar3 + 0x10;
        local_140 = 0;
        lVar17 = 0;
        iVar15 = 0;
        local_150 = lVar5 << 5;
        local_148 = lVar5 << 5;
        do {
          uVar1 = cstr_info.tile[local_170].ph[lVar17] * cstr_info.tile[local_170].pw[lVar17];
          if (0 < (int)uVar1) {
            uVar18 = (ulong)uVar1;
            lVar21 = (local_140 * uVar18 + lVar5) * lVar12 + 0x10;
            lVar8 = ((int)(compno * uVar1) * lVar3 + lVar17) * lVar12 + 0x10;
            lVar4 = local_150 * uVar18 + 0x10;
            local_110 = local_148 * uVar18 + 0x10;
            local_128 = local_138;
            uVar19 = 0;
            do {
              lVar10 = local_110;
              lVar14 = lVar4;
              lVar16 = lVar8;
              lVar20 = local_128;
              lVar22 = lVar21;
              uVar24 = (ulong)(uint)cstr_info.numlayers;
              if (0 < cstr_info.numlayers) {
                do {
                  switch(cstr_info.prog) {
                  case LRCP:
                    local_108 = *(long *)((long)cstr_info.tile[local_170].packet + lVar10 + -0x10);
                    local_120 = *(long *)((long)&(cstr_info.tile[local_170].packet)->start_pos +
                                         lVar10);
                    break;
                  case RLCP:
                    local_108 = *(long *)((long)cstr_info.tile[local_170].packet + lVar14 + -0x10);
                    local_120 = *(long *)((long)&(cstr_info.tile[local_170].packet)->start_pos +
                                         lVar14);
                    break;
                  case RPCL:
                    local_108 = *(long *)((long)cstr_info.tile[local_170].packet + lVar22 + -0x10);
                    local_120 = *(long *)((long)&(cstr_info.tile[local_170].packet)->start_pos +
                                         lVar22);
                    break;
                  case PCRL:
                    local_108 = *(long *)((long)cstr_info.tile[local_170].packet + lVar20 + -0x10);
                    local_120 = *(long *)((long)&(cstr_info.tile[local_170].packet)->start_pos +
                                         lVar20);
                    break;
                  case CPRL:
                    local_108 = *(long *)((long)cstr_info.tile[local_170].packet + lVar16 + -0x10);
                    local_120 = *(long *)((long)&(cstr_info.tile[local_170].packet)->start_pos +
                                         lVar16);
                    break;
                  default:
                    write_ppixfaix_cold_1();
                  }
                  cio_write(cio,local_108 - coff,4);
                  cio_write(cio,(local_120 - local_108) + 1,4);
                  uVar24 = uVar24 - 1;
                  lVar10 = lVar10 + lVar7 * lVar3 * uVar18;
                  lVar14 = lVar14 + lVar7 * uVar18;
                  lVar16 = lVar16 + 0x20;
                  lVar20 = lVar20 + 0x20;
                  lVar22 = lVar22 + 0x20;
                } while (uVar24 != 0);
                iVar15 = iVar15 + cstr_info.numlayers;
              }
              uVar19 = uVar19 + 1;
              lVar21 = lVar21 + lVar2;
              local_128 = local_128 + lVar2 * lVar3;
              lVar8 = lVar8 + lVar12 * lVar3;
              lVar4 = lVar4 + 0x20;
              local_110 = local_110 + 0x20;
            } while (uVar19 != uVar18);
          }
          lVar17 = lVar17 + 1;
          local_140 = local_140 + lVar6;
          local_138 = local_138 + lVar12;
          local_150 = local_150 + lVar2;
          local_148 = local_148 + lVar7;
        } while (lVar17 != lVar13);
      }
      iVar11 = iVar23 - iVar15;
      if (iVar11 != 0 && iVar15 <= iVar23) {
        do {
          cio_write(cio,0,4);
          cio_write(cio,0,4);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      local_170 = local_170 + 1;
    } while (local_170 != (v & 0xffffffff));
  }
  iVar23 = cio_tell(cio);
  cio_seek(cio,pos);
  cio_write(cio,(long)(iVar23 - pos),4);
  cio_seek(cio,iVar23);
  return iVar23 - pos;
}

Assistant:

int write_ppixfaix( int coff, int compno, opj_codestream_info_t cstr_info, opj_bool EPHused, int j2klen, opj_cio_t *cio)
{
  int len, lenp, tileno, version, i, nmax, size_of_coding; /* 4 or 8*/
  opj_tile_info_t *tile_Idx;
  opj_packet_info_t packet;
  int resno, precno, layno, num_packet;
  int numOfres, numOfprec, numOflayers;
  packet.end_pos = packet.end_ph_pos = packet.start_pos = -1;
  (void)EPHused; /* unused ? */

  if( j2klen > pow( 2, 32)){
    size_of_coding =  8;
    version = 1;
  }
  else{
    size_of_coding = 4;
    version = 0;
  }
  
  lenp = cio_tell( cio);
  cio_skip( cio, 4);              /* L [at the end]      */
  cio_write( cio, JPIP_FAIX, 4);  /* FAIX                */ 
  cio_write( cio, version, 1);     /* Version 0 = 4 bytes */

  nmax = 0;
  for( i=0; i<=cstr_info.numdecompos[compno]; i++)
    nmax += cstr_info.tile[0].ph[i] * cstr_info.tile[0].pw[i] * cstr_info.numlayers;
  
  cio_write( cio, nmax, size_of_coding); /* NMAX */
  cio_write( cio, cstr_info.tw*cstr_info.th, size_of_coding);      /* M    */

  for( tileno=0; tileno<cstr_info.tw*cstr_info.th; tileno++){
    tile_Idx = &cstr_info.tile[ tileno];
 
    num_packet=0;
    numOfres = cstr_info.numdecompos[compno] + 1;
  
    for( resno=0; resno<numOfres ; resno++){
      numOfprec = tile_Idx->pw[resno]*tile_Idx->ph[resno];
      for( precno=0; precno<numOfprec; precno++){
	numOflayers = cstr_info.numlayers;
	for( layno=0; layno<numOflayers; layno++){

	  switch ( cstr_info.prog){
	  case LRCP:
	    packet = tile_Idx->packet[ ((layno*numOfres+resno)*cstr_info.numcomps+compno)*numOfprec+precno];
	    break;
	  case RLCP:
	    packet = tile_Idx->packet[ ((resno*numOflayers+layno)*cstr_info.numcomps+compno)*numOfprec+precno];
	    break;
	  case RPCL:
	    packet = tile_Idx->packet[ ((resno*numOfprec+precno)*cstr_info.numcomps+compno)*numOflayers+layno];
	    break;
	  case PCRL:
	    packet = tile_Idx->packet[ ((precno*cstr_info.numcomps+compno)*numOfres+resno)*numOflayers + layno];
	    break;
	  case CPRL:
	    packet = tile_Idx->packet[ ((compno*numOfprec+precno)*numOfres+resno)*numOflayers + layno];
	    break;
	  default:
	    fprintf( stderr, "failed to ppix indexing\n");
	  }

	  cio_write( cio, packet.start_pos-coff, size_of_coding);             /* start position */
	  cio_write( cio, packet.end_pos-packet.start_pos+1, size_of_coding); /* length         */
	  
	  num_packet++;
	}
      }
    }
  
    while( num_packet < nmax){     /* PADDING */
      cio_write( cio, 0, size_of_coding); /* start position            */
      cio_write( cio, 0, size_of_coding); /* length                    */
      num_packet++;
    }   
  }

  len = cio_tell( cio)-lenp;
  cio_seek( cio, lenp);
  cio_write( cio, len, 4);        /* L  */
  cio_seek( cio, lenp+len);

  return len;
}